

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O0

StatusOr<int>
google::protobuf::json_internal::Proto2Descriptor::EnumNumberByName
          (Field f,string_view name,bool case_insensitive)

{
  string_view name_00;
  int iVar1;
  int iVar2;
  EnumDescriptor *pEVar3;
  DescriptorStringView this;
  ulong uVar4;
  undefined7 in_register_00000009;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  byte in_R8B;
  undefined1 auVar6 [16];
  StatusOr<int> SVar7;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292> local_120;
  string local_110;
  undefined1 local_f0 [16];
  Status local_e0;
  int local_d4;
  Field local_d0;
  size_t local_c8;
  EnumValueDescriptor *local_c0;
  EnumValueDescriptor *ev_1;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292> local_a8;
  string local_98;
  undefined1 local_78 [16];
  Status local_68;
  int local_5c;
  undefined1 local_58 [16];
  Field local_48;
  size_t local_40;
  EnumValueDescriptor *local_38;
  EnumValueDescriptor *ev;
  int i;
  bool case_insensitive_local;
  Field f_local;
  string_view name_local;
  
  name_local._M_len = CONCAT71(in_register_00000009,case_insensitive);
  f_local = (Field)name._M_str;
  _i = (FieldDescriptor *)name._M_len;
  ev._7_1_ = in_R8B & 1;
  name_local._M_str = (char *)f;
  if (ev._7_1_ == 0) {
    pEVar3 = FieldDescriptor::enum_type(_i);
    local_d0 = f_local;
    local_c8 = name_local._M_len;
    name_00._M_str = (char *)name_local._M_len;
    name_00._M_len = (size_t)f_local;
    local_c0 = EnumDescriptor::FindValueByName(pEVar3,name_00);
    if (local_c0 == (EnumValueDescriptor *)0x0) {
      absl::lts_20240722::str_format_internal::
      FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292>::FormatSpecTemplate
                (&local_120,"unknown enum value: \'%s\'");
      absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                (&local_110,&local_120,(basic_string_view<char,_std::char_traits<char>_> *)&f_local)
      ;
      local_f0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_110);
      absl::lts_20240722::InvalidArgumentError(&local_e0,local_f0._0_8_,local_f0._8_8_);
      absl::lts_20240722::StatusOr<int>::StatusOr<absl::lts_20240722::Status,_0>
                ((StatusOr<int> *)f,&local_e0);
      absl::lts_20240722::Status::~Status(&local_e0);
      std::__cxx11::string::~string((string *)&local_110);
      uVar5 = extraout_RDX_02;
    }
    else {
      local_d4 = EnumValueDescriptor::number(local_c0);
      absl::lts_20240722::StatusOr<int>::StatusOr<int,_0>((StatusOr<int> *)f,&local_d4);
      uVar5 = extraout_RDX_01;
    }
  }
  else {
    ev._0_4_ = 0;
    while( true ) {
      iVar1 = (int)ev;
      pEVar3 = FieldDescriptor::enum_type(_i);
      iVar2 = EnumDescriptor::value_count(pEVar3);
      if (iVar2 <= iVar1) break;
      pEVar3 = FieldDescriptor::enum_type(_i);
      local_38 = EnumDescriptor::value(pEVar3,(int)ev);
      local_48 = f_local;
      local_40 = name_local._M_len;
      this = EnumValueDescriptor::name_abi_cxx11_(local_38);
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
      local_58 = auVar6;
      uVar4 = absl::lts_20240722::EqualsIgnoreCase(local_48,local_40,auVar6._0_8_,auVar6._8_8_);
      if ((uVar4 & 1) != 0) {
        local_5c = EnumValueDescriptor::number(local_38);
        absl::lts_20240722::StatusOr<int>::StatusOr<int,_0>((StatusOr<int> *)f,&local_5c);
        uVar5 = extraout_RDX;
        goto LAB_004cf274;
      }
      ev._0_4_ = (int)ev + 1;
    }
    absl::lts_20240722::str_format_internal::
    FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292>::FormatSpecTemplate
              (&local_a8,"unknown enum value: \'%s\'");
    absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
              (&local_98,&local_a8,(basic_string_view<char,_std::char_traits<char>_> *)&f_local);
    local_78 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_98);
    absl::lts_20240722::InvalidArgumentError(&local_68,local_78._0_8_,local_78._8_8_);
    absl::lts_20240722::StatusOr<int>::StatusOr<absl::lts_20240722::Status,_0>
              ((StatusOr<int> *)f,&local_68);
    absl::lts_20240722::Status::~Status(&local_68);
    std::__cxx11::string::~string((string *)&local_98);
    uVar5 = extraout_RDX_00;
  }
LAB_004cf274:
  SVar7.super_StatusOrData<int>._8_8_ = uVar5;
  SVar7.super_StatusOrData<int>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)f;
  return (StatusOr<int>)SVar7.super_StatusOrData<int>;
}

Assistant:

static absl::StatusOr<int32_t> EnumNumberByName(Field f,
                                                  absl::string_view name,
                                                  bool case_insensitive) {
    if (case_insensitive) {
      for (int i = 0; i < f->enum_type()->value_count(); ++i) {
        const auto* ev = f->enum_type()->value(i);
        if (absl::EqualsIgnoreCase(name, ev->name())) {
          return ev->number();
        }
      }
      return absl::InvalidArgumentError(
          absl::StrFormat("unknown enum value: '%s'", name));
    }

    if (const auto* ev = f->enum_type()->FindValueByName(name)) {
      return ev->number();
    }

    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum value: '%s'", name));
  }